

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::ssl_parse_clienthello_tlsext(SSL_HANDSHAKE *hs,SSL_CLIENT_HELLO *client_hello)

{
  ushort uVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  ushort *puVar5;
  _func_int_SSL_ptr_int_ptr_void_ptr *p_Var6;
  uint i;
  long lVar7;
  ssl_ctx_st *psVar8;
  CBS *pCVar9;
  byte bVar10;
  SSL *pSVar11;
  uint16_t type;
  uint8_t alert;
  CBS extensions;
  CBS extension;
  ushort local_64;
  byte local_61;
  CBS local_60;
  SSL *local_50;
  SSL_CLIENT_HELLO *local_48;
  CBS local_40;
  
  pSVar11 = hs->ssl;
  (hs->extensions).sent = 0;
  local_60.data = client_hello->extensions;
  local_60.len = client_hello->extensions_len;
  local_48 = client_hello;
  if (local_60.len != 0) {
    do {
      iVar4 = CBS_get_u16(&local_60,&local_64);
      if ((iVar4 == 0) || (iVar4 = CBS_get_u16_length_prefixed(&local_60,&local_40), iVar4 == 0)) {
        bVar10 = 0x32;
        goto LAB_0023b7e7;
      }
      puVar5 = &kExtensions;
      lVar7 = 0;
      do {
        if (*puVar5 == local_64) {
          (hs->extensions).sent = (hs->extensions).sent | 1 << ((byte)lVar7 & 0x1f);
          local_61 = 0x32;
          cVar3 = (**(code **)(puVar5 + 0xc))(hs,&local_61,&local_40);
          bVar10 = local_61;
          if (cVar3 == '\0') {
            ERR_put_error(0x10,0,0x95,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                          ,0xfd2);
            ERR_add_error_dataf("extension %u",(ulong)local_64);
            goto LAB_0023b7e7;
          }
          break;
        }
        lVar7 = lVar7 + 1;
        puVar5 = puVar5 + 0x14;
      } while (lVar7 != 0x1c);
    } while (local_60.len != 0);
  }
  puVar5 = &kExtensions;
  lVar7 = 0;
  local_50 = pSVar11;
  do {
    if (((hs->extensions).sent >> ((uint)lVar7 & 0x1f) & 1) == 0) {
      uVar1 = *puVar5;
      if ((uVar1 == 0xff01) &&
         (bVar2 = ssl_client_cipher_list_contains_cipher(local_48,0xff), bVar2)) {
        local_40.data = "";
        local_40.len = 1;
        (hs->extensions).sent = (hs->extensions).sent | 1 << ((byte)lVar7 & 0x1f);
        pCVar9 = &local_40;
      }
      else {
        pCVar9 = (CBS *)0x0;
      }
      local_64 = CONCAT11(local_64._1_1_,0x32);
      cVar3 = (**(code **)(puVar5 + 0xc))(hs,&local_64,pCVar9);
      if (cVar3 == '\0') {
        ERR_put_error(0x10,0,0xa4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0xfee);
        ERR_add_error_dataf("extension %u",(ulong)(uint)uVar1);
        pSVar11 = local_50;
        bVar10 = (byte)local_64;
LAB_0023b7e7:
        ssl_send_alert(pSVar11,2,(uint)bVar10);
        return false;
      }
    }
    lVar7 = lVar7 + 1;
    puVar5 = puVar5 + 0x14;
  } while (lVar7 != 0x1c);
  pSVar11 = hs->ssl;
  local_60.data = (uint8_t *)CONCAT44(local_60.data._4_4_,0x70);
  psVar8 = (pSVar11->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl;
  p_Var6 = psVar8->servername_callback;
  if (p_Var6 == (_func_int_SSL_ptr_int_ptr_void_ptr *)0x0) {
    psVar8 = (pSVar11->session_ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
             _M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl;
    p_Var6 = psVar8->servername_callback;
    if (p_Var6 == (_func_int_SSL_ptr_int_ptr_void_ptr *)0x0) goto LAB_0023b705;
  }
  iVar4 = (*p_Var6)(pSVar11,(int *)&local_60,psVar8->servername_arg);
  if (iVar4 == 2) {
    ssl_send_alert(pSVar11,2,(int)local_60.data);
    ERR_put_error(0x10,0,0x84,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0x1002);
    return false;
  }
  if (iVar4 != 3) {
    *(uint *)&hs->field_0x6c8 =
         *(uint *)&hs->field_0x6c8 & 0xfffffeff |
         (uint)((pSVar11->s3->hostname)._M_t.super___uniq_ptr_impl<char,_bssl::internal::Deleter>.
                _M_t.super__Tuple_impl<0UL,_char_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_char_*,_false>._M_head_impl != (char *)0x0) << 8;
    return true;
  }
LAB_0023b705:
  hs->field_0x6c9 = hs->field_0x6c9 & 0xfe;
  return true;
}

Assistant:

bool ssl_parse_clienthello_tlsext(SSL_HANDSHAKE *hs,
                                  const SSL_CLIENT_HELLO *client_hello) {
  SSL *const ssl = hs->ssl;
  int alert = SSL_AD_DECODE_ERROR;
  if (!ssl_scan_clienthello_tlsext(hs, client_hello, &alert)) {
    ssl_send_alert(ssl, SSL3_AL_FATAL, alert);
    return false;
  }

  if (!ssl_check_clienthello_tlsext(hs)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_CLIENTHELLO_TLSEXT);
    return false;
  }

  return true;
}